

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[42],unsigned_int,char[2]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [41],char (*Args_1) [15],
          uint *Args_2,char (*Args_3) [11],uint *Args_4,char (*Args_5) [16],uint *Args_6,
          char (*Args_7) [42],uint *Args_8,char (*Args_9) [2])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[42],unsigned_int,char[2]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [41])this,(char (*) [15])Args,(uint *)Args_1,(char (*) [11])Args_2,
             (uint *)Args_3,(char (*) [16])Args_4,(uint *)Args_5,(char (*) [42])Args_6,
             (uint *)Args_7,(char (*) [2])Args_8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}